

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmbtoken.cc
# Opt level: O3

int scalar_from_cbs(CBS *cbs,EC_GROUP *group,EC_SCALAR *out)

{
  uint uVar1;
  int iVar2;
  BIGNUM *bn;
  CBS tmp;
  CBS local_28;
  
  bn = EC_GROUP_get0_order(group);
  uVar1 = BN_num_bytes(bn);
  iVar2 = CBS_get_bytes(cbs,&local_28,(ulong)uVar1);
  if (iVar2 == 0) {
    ERR_put_error(0x20,0,0x69,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/trust_token/pmbtoken.cc"
                  ,0x191);
  }
  else {
    ec_scalar_from_bytes(group,out,local_28.data,local_28.len);
  }
  return (uint)(iVar2 != 0);
}

Assistant:

static int scalar_from_cbs(CBS *cbs, const EC_GROUP *group, EC_SCALAR *out) {
  size_t scalar_len = BN_num_bytes(EC_GROUP_get0_order(group));
  CBS tmp;
  if (!CBS_get_bytes(cbs, &tmp, scalar_len)) {
    OPENSSL_PUT_ERROR(TRUST_TOKEN, TRUST_TOKEN_R_DECODE_FAILURE);
    return 0;
  }

  ec_scalar_from_bytes(group, out, CBS_data(&tmp), CBS_len(&tmp));
  return 1;
}